

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdgif.c
# Opt level: O1

void ReadColorMap(gif_source_ptr sinfo,int cmaplen,JSAMPARRAY cmap)

{
  j_compress_ptr pjVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  ulong uVar4;
  
  if (0 < cmaplen) {
    uVar4 = 0;
    do {
      iVar3 = getc((FILE *)(sinfo->pub).input_file);
      if (iVar3 == -1) {
        pjVar1 = sinfo->cinfo;
        pjVar2 = pjVar1->err;
        pjVar2->msg_code = 0x2b;
        (*pjVar2->error_exit)((j_common_ptr)pjVar1);
      }
      (*cmap)[uVar4] = (JSAMPLE)iVar3;
      iVar3 = getc((FILE *)(sinfo->pub).input_file);
      if (iVar3 == -1) {
        pjVar1 = sinfo->cinfo;
        pjVar2 = pjVar1->err;
        pjVar2->msg_code = 0x2b;
        (*pjVar2->error_exit)((j_common_ptr)pjVar1);
      }
      cmap[1][uVar4] = (JSAMPLE)iVar3;
      iVar3 = getc((FILE *)(sinfo->pub).input_file);
      if (iVar3 == -1) {
        pjVar1 = sinfo->cinfo;
        pjVar2 = pjVar1->err;
        pjVar2->msg_code = 0x2b;
        (*pjVar2->error_exit)((j_common_ptr)pjVar1);
      }
      cmap[2][uVar4] = (JSAMPLE)iVar3;
      uVar4 = uVar4 + 1;
    } while ((uint)cmaplen != uVar4);
  }
  return;
}

Assistant:

LOCAL(void)
ReadColorMap(gif_source_ptr sinfo, int cmaplen, JSAMPARRAY cmap)
/* Read a GIF colormap */
{
  int i;

  for (i = 0; i < cmaplen; i++) {
#if BITS_IN_JSAMPLE == 8
#define UPSCALE(x)  (x)
#else
#define UPSCALE(x)  ((x) << (BITS_IN_JSAMPLE - 8))
#endif
    cmap[CM_RED][i]   = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_GREEN][i] = (JSAMPLE)UPSCALE(ReadByte(sinfo));
    cmap[CM_BLUE][i]  = (JSAMPLE)UPSCALE(ReadByte(sinfo));
  }
}